

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O3

string * __thiscall
LinearRegression::generateParameters_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  undefined8 *puVar1;
  var_bitset *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  string *psVar4;
  char cVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  size_t sVar16;
  char cVar17;
  undefined8 uVar18;
  string __str;
  string __str_1;
  string initParam;
  string __str_3;
  string __str_2;
  string numOfParameters;
  string constructGrad;
  string constructParam;
  string __str_4;
  string *outString;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  string local_368;
  ulong *local_348;
  long local_340;
  ulong local_338;
  undefined8 uStack_330;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  string local_308;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  undefined8 uStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  LinearRegression *local_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  var_bitset *local_100;
  ulong *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  ulong local_e8 [2];
  string *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  this_01 = &this->_parameterIndex;
  local_228 = this;
  local_d8 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,0x65);
  local_388 = &local_378;
  std::__cxx11::string::_M_construct((ulong)&local_388,'\x03');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  local_288 = &local_278;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_278 = *puVar9;
    lStack_270 = plVar7[3];
  }
  else {
    local_278 = *puVar9;
    local_288 = (ulong *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_3a8 = &local_398;
  std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x03');
  uVar15 = 0xf;
  if (local_288 != &local_278) {
    uVar15 = local_278;
  }
  if (uVar15 < (ulong)(local_3a0 + local_280)) {
    uVar15 = 0xf;
    if (local_3a8 != &local_398) {
      uVar15 = local_398;
    }
    if (uVar15 < (ulong)(local_3a0 + local_280)) goto LAB_00134dfd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_288);
  }
  else {
LAB_00134dfd:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_3a8);
  }
  local_1a0 = &local_190;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar8[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (undefined8 *)*puVar8;
  }
  local_198 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  paVar2 = &local_160.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar7[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_160._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_140.field_2._M_allocated_capacity = *psVar10;
    local_140.field_2._8_8_ = plVar7[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar10;
    local_140._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_140._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"numberOfParameters = ","");
  this_00 = &(local_228->super_Application)._features;
  local_100 = &local_228->_categoricalFeatures;
  uVar14 = 1;
  sVar16 = 0;
  do {
    bVar6 = std::bitset<100UL>::test(this_00,sVar16);
    if (bVar6) {
      bVar6 = std::bitset<100UL>::test(local_100,sVar16);
      if (bVar6) {
        uVar15 = **(ulong **)
                   &((*(local_228->parameterQueries[sVar16]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001350bc;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001350bc;
            }
            if (uVar13 < 10000) goto LAB_001350bc;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_001350bc:
        local_3a8 = &local_398;
        std::__cxx11::string::_M_construct((ulong)&local_3a8,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_3a8,(uint)local_3a0,uVar15);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,0x2a5219);
        local_388 = &local_378;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_378 = *plVar11;
          lStack_370 = plVar7[3];
        }
        else {
          local_378 = *plVar11;
          local_388 = (long *)*plVar7;
        }
        local_380 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_388);
        local_288 = &local_278;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_278 = *puVar9;
          lStack_270 = puVar8[3];
        }
        else {
          local_278 = *puVar9;
          local_288 = (ulong *)*puVar8;
        }
        local_280 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_288);
        if (local_288 != &local_278) {
          operator_delete(local_288);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
      }
      else {
        (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar16] = uVar14;
        uVar14 = uVar14 + 1;
      }
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 100);
  (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[100] = 0;
  uVar15 = uVar14 + 1;
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar13 = uVar15;
    cVar5 = '\x04';
    do {
      cVar17 = cVar5;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0013527c;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0013527c;
      }
      if (uVar13 < 10000) goto LAB_0013527c;
      bVar6 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar17 + '\x04';
    } while (bVar6);
    cVar17 = cVar17 + '\x01';
  }
LAB_0013527c:
  local_388 = &local_378;
  std::__cxx11::string::_M_construct((ulong)&local_388,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_388,(uint)local_380,uVar15);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  local_288 = &local_278;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_278 = *puVar9;
    lStack_270 = plVar7[3];
  }
  else {
    local_278 = *puVar9;
    local_288 = (ulong *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_288);
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  local_248 = &local_238;
  std::__cxx11::string::_M_construct((ulong)&local_248,'\x06');
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1a0);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_258 = *puVar9;
    uStack_250 = puVar8[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *puVar9;
    local_268 = (ulong *)*puVar8;
  }
  local_260 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
  uVar13 = 0xf;
  if (local_268 != &local_258) {
    uVar13 = local_258;
  }
  if (uVar13 < (ulong)(local_1b8 + local_260)) {
    uVar13 = 0xf;
    if (local_1c0 != &local_1b0) {
      uVar13 = local_1b0;
    }
    if (uVar13 < (ulong)(local_1b8 + local_260)) goto LAB_00135462;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_268);
  }
  else {
LAB_00135462:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1c0);
  }
  local_2a8 = &local_298;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_298 = *puVar9;
    lStack_290 = puVar8[3];
  }
  else {
    local_298 = *puVar9;
    local_2a8 = (ulong *)*puVar8;
  }
  local_2a0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2c8.field_2._M_allocated_capacity = *puVar9;
    local_2c8.field_2._8_8_ = puVar8[3];
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *puVar9;
    local_2c8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2c8._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\x06');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    uVar18 = local_2c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_1f8 + local_2c8._M_string_length) {
    uVar13 = 0xf;
    if (local_200 != &local_1f0) {
      uVar13 = local_1f0;
    }
    if (uVar13 < local_1f8 + local_2c8._M_string_length) goto LAB_001355ba;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_200,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
  }
  else {
LAB_001355ba:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_200);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308.field_2._8_8_ = puVar8[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_308._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_308);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2d8 = *puVar9;
    uStack_2d0 = puVar8[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar9;
    local_2e8 = (ulong *)*puVar8;
  }
  local_2e0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_220 = &local_210;
  std::__cxx11::string::_M_construct((ulong)&local_220,'\x06');
  uVar13 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar13 = local_2d8;
  }
  if (uVar13 < (ulong)(local_218 + local_2e0)) {
    uVar13 = 0xf;
    if (local_220 != &local_210) {
      uVar13 = local_210;
    }
    if (uVar13 < (ulong)(local_218 + local_2e0)) goto LAB_00135712;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_00135712:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_220);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368.field_2._8_8_ = puVar8[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_368._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
  local_348 = &local_338;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_338 = *puVar9;
    uStack_330 = puVar8[3];
  }
  else {
    local_338 = *puVar9;
    local_348 = (ulong *)*puVar8;
  }
  local_340 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1e0 = &local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x06');
  uVar13 = 0xf;
  if (local_348 != &local_338) {
    uVar13 = local_338;
  }
  if (uVar13 < (ulong)(local_1d8 + local_340)) {
    uVar13 = 0xf;
    if (local_1e0 != &local_1d0) {
      uVar13 = local_1d0;
    }
    if (uVar13 < (ulong)(local_1d8 + local_340)) goto LAB_0013584d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_348);
  }
  else {
LAB_0013584d:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_1e0);
  }
  local_328 = &local_318;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_318 = *puVar9;
    lStack_310 = puVar8[3];
  }
  else {
    local_318 = *puVar9;
    local_328 = (ulong *)*puVar8;
  }
  local_320 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_398 = *puVar9;
    lStack_390 = puVar8[3];
    local_3a8 = &local_398;
  }
  else {
    local_398 = *puVar9;
    local_3a8 = (ulong *)*puVar8;
  }
  local_3a0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  uVar13 = 0xf;
  if (local_3a8 != &local_398) {
    uVar13 = local_398;
  }
  if (uVar13 < local_180._M_string_length + local_3a0) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      uVar18 = local_180.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_180._M_string_length + local_3a0) goto LAB_00135987;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_3a8);
  }
  else {
LAB_00135987:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_180._M_dataplus._M_p);
  }
  local_388 = &local_378;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_378 = *plVar7;
    lStack_370 = puVar8[3];
  }
  else {
    local_378 = *plVar7;
    local_388 = (long *)*puVar8;
  }
  local_380 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  local_288 = &local_278;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_278 = *puVar9;
    lStack_270 = plVar7[3];
  }
  else {
    local_278 = *puVar9;
    local_288 = (ulong *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if ((local_228->_categoricalFeatures).super__Base_bitset<2UL>._M_w[1] != 0 ||
      (local_228->_categoricalFeatures).super__Base_bitset<2UL>._M_w[0] != 0) {
    local_348 = &local_338;
    std::__cxx11::string::_M_construct((ulong)&local_348,'\x06');
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
    puVar9 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar9) {
      local_318 = *puVar9;
      lStack_310 = puVar8[3];
      local_328 = &local_318;
    }
    else {
      local_318 = *puVar9;
      local_328 = (ulong *)*puVar8;
    }
    local_320 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    cVar17 = '\x01';
    if (9 < uVar15) {
      uVar13 = uVar15;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar13 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_00135cb1;
        }
        if (uVar13 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_00135cb1;
        }
        if (uVar13 < 10000) goto LAB_00135cb1;
        bVar6 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar5 = cVar17 + '\x04';
      } while (bVar6);
      cVar17 = cVar17 + '\x01';
    }
LAB_00135cb1:
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_368,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar15);
    uVar15 = 0xf;
    if (local_328 != &local_318) {
      uVar15 = local_318;
    }
    if (uVar15 < local_368._M_string_length + local_320) {
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        uVar18 = local_368.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_368._M_string_length + local_320) goto LAB_00135d2b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_328);
    }
    else {
LAB_00135d2b:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_368._M_dataplus._M_p)
      ;
    }
    puVar9 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar9) {
      local_398 = *puVar9;
      lStack_390 = puVar8[3];
      local_3a8 = &local_398;
    }
    else {
      local_398 = *puVar9;
      local_3a8 = (ulong *)*puVar8;
    }
    local_3a0 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)puVar9 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_378 = *plVar7;
      lStack_370 = puVar8[3];
      local_388 = &local_378;
    }
    else {
      local_378 = *plVar7;
      local_388 = (long *)*puVar8;
    }
    local_380 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_388);
    if (local_388 != &local_378) {
      operator_delete(local_388);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348);
    }
  }
  sVar16 = 0;
  do {
    bVar6 = std::bitset<100UL>::test(this_00,sVar16);
    if (bVar6) {
      bVar6 = std::bitset<100UL>::test(local_100,sVar16);
      if (bVar6) {
        puVar9 = *(ulong **)
                  &((*(local_228->parameterQueries[sVar16]->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->_incoming).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data;
        local_348 = &local_338;
        std::__cxx11::string::_M_construct((ulong)&local_348,'\x03');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
        local_328 = &local_318;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_318 = *puVar12;
          lStack_310 = plVar7[3];
        }
        else {
          local_318 = *puVar12;
          local_328 = (ulong *)*plVar7;
        }
        local_320 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_368,local_228,sVar16);
        uVar15 = 0xf;
        if (local_328 != &local_318) {
          uVar15 = local_318;
        }
        if (uVar15 < local_368._M_string_length + local_320) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            uVar18 = local_368.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_368._M_string_length + local_320) goto LAB_00135fa0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_00135fa0:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_368._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_398 = *puVar12;
          lStack_390 = puVar8[3];
          local_3a8 = &local_398;
        }
        else {
          local_398 = *puVar12;
          local_3a8 = (ulong *)*puVar8;
        }
        local_3a0 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_388 = &local_378;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_378 = *plVar11;
          lStack_370 = plVar7[3];
        }
        else {
          local_378 = *plVar11;
          local_388 = (long *)*plVar7;
        }
        local_380 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_388);
        if (local_388 != &local_378) {
          operator_delete(local_388);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348);
        }
        local_2e8 = &local_2d8;
        std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_368.field_2._M_allocated_capacity = *puVar12;
          local_368.field_2._8_8_ = plVar7[3];
        }
        else {
          local_368.field_2._M_allocated_capacity = *puVar12;
          local_368._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_368._M_string_length = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_308,local_228,sVar16);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          uVar18 = local_368.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_308._M_string_length + local_368._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            uVar18 = local_308.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_308._M_string_length + local_368._M_string_length)
          goto LAB_001361bb;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_308,0,(char *)0x0,(ulong)local_368._M_dataplus._M_p);
        }
        else {
LAB_001361bb:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_368,(ulong)local_308._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_338 = *puVar12;
          uStack_330 = puVar8[3];
          local_348 = &local_338;
        }
        else {
          local_338 = *puVar12;
          local_348 = (ulong *)*puVar8;
        }
        local_340 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
        local_328 = &local_318;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_318 = *puVar12;
          lStack_310 = plVar7[3];
        }
        else {
          local_318 = *puVar12;
          local_328 = (ulong *)*plVar7;
        }
        local_320 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001362e2;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001362e2;
            }
            if (uVar13 < 10000) goto LAB_001362e2;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_001362e2:
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_2c8._M_dataplus._M_p,(uint)local_2c8._M_string_length,uVar15);
        uVar15 = 0xf;
        if (local_328 != &local_318) {
          uVar15 = local_318;
        }
        if (uVar15 < local_2c8._M_string_length + local_320) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            uVar18 = local_2c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_2c8._M_string_length + local_320) goto LAB_00136381;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_00136381:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_2c8._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_398 = *puVar12;
          lStack_390 = puVar8[3];
          local_3a8 = &local_398;
        }
        else {
          local_398 = *puVar12;
          local_3a8 = (ulong *)*puVar8;
        }
        local_3a0 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_388 = &local_378;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_378 = *plVar11;
          lStack_370 = plVar7[3];
        }
        else {
          local_378 = *plVar11;
          local_388 = (long *)*plVar7;
        }
        local_380 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_388);
        if (local_388 != &local_378) {
          operator_delete(local_388);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_248 = &local_238;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_238 = *puVar12;
          lStack_230 = plVar7[3];
        }
        else {
          local_238 = *puVar12;
          local_248 = (ulong *)*plVar7;
        }
        local_240 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001365f4;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001365f4;
            }
            if (uVar13 < 10000) goto LAB_001365f4;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_001365f4:
        local_200 = &local_1f0;
        std::__cxx11::string::_M_construct((ulong)&local_200,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_200,(uint)local_1f8,uVar15);
        uVar15 = 0xf;
        if (local_248 != &local_238) {
          uVar15 = local_238;
        }
        if (uVar15 < (ulong)(local_1f8 + local_240)) {
          uVar15 = 0xf;
          if (local_200 != &local_1f0) {
            uVar15 = local_1f0;
          }
          if (uVar15 < (ulong)(local_1f8 + local_240)) goto LAB_00136696;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_248);
        }
        else {
LAB_00136696:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_200);
        }
        local_268 = &local_258;
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_258 = *puVar12;
          uStack_250 = puVar8[3];
        }
        else {
          local_258 = *puVar12;
          local_268 = (ulong *)*puVar8;
        }
        local_260 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_298 = *puVar12;
          lStack_290 = puVar8[3];
          local_2a8 = &local_298;
        }
        else {
          local_298 = *puVar12;
          local_2a8 = (ulong *)*puVar8;
        }
        local_2a0 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001367d1;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001367d1;
            }
            if (uVar13 < 10000) goto LAB_001367d1;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_001367d1:
        local_220 = &local_210;
        std::__cxx11::string::_M_construct((ulong)&local_220,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_220,(uint)local_218,uVar15);
        uVar15 = 0xf;
        if (local_2a8 != &local_298) {
          uVar15 = local_298;
        }
        if (uVar15 < (ulong)(local_218 + local_2a0)) {
          uVar15 = 0xf;
          if (local_220 != &local_210) {
            uVar15 = local_210;
          }
          if (uVar15 < (ulong)(local_218 + local_2a0)) goto LAB_00136870;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_2a8);
        }
        else {
LAB_00136870:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_220);
        }
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_2c8.field_2._M_allocated_capacity = *puVar9;
          local_2c8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2c8.field_2._M_allocated_capacity = *puVar9;
          local_2c8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2c8._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_308.field_2._M_allocated_capacity = *puVar9;
          local_308.field_2._8_8_ = puVar8[3];
        }
        else {
          local_308.field_2._M_allocated_capacity = *puVar9;
          local_308._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_308._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,'\t');
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          uVar18 = local_308.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_1d8 + local_308._M_string_length) {
          uVar15 = 0xf;
          if (local_1e0 != &local_1d0) {
            uVar15 = local_1d0;
          }
          if (uVar15 < local_1d8 + local_308._M_string_length) goto LAB_001369d9;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_308._M_dataplus._M_p);
        }
        else {
LAB_001369d9:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_1e0);
        }
        local_2e8 = &local_2d8;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_2d8 = *puVar9;
          uStack_2d0 = puVar8[3];
        }
        else {
          local_2d8 = *puVar9;
          local_2e8 = (ulong *)*puVar8;
        }
        local_2e0 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_368.field_2._M_allocated_capacity = *puVar9;
          local_368.field_2._8_8_ = puVar8[3];
        }
        else {
          local_368.field_2._M_allocated_capacity = *puVar9;
          local_368._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_368._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_180,local_228,sVar16);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          uVar18 = local_368.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_180._M_string_length + local_368._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar18 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_180._M_string_length + local_368._M_string_length)
          goto LAB_00136b0f;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_180,0,(char *)0x0,(ulong)local_368._M_dataplus._M_p);
        }
        else {
LAB_00136b0f:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_368,(ulong)local_180._M_dataplus._M_p);
        }
        local_348 = &local_338;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_338 = *puVar9;
          uStack_330 = puVar8[3];
        }
        else {
          local_338 = *puVar9;
          local_348 = (ulong *)*puVar8;
        }
        local_340 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        local_328 = &local_318;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_318 = *puVar9;
          lStack_310 = puVar8[3];
        }
        else {
          local_318 = *puVar9;
          local_328 = (ulong *)*puVar8;
        }
        local_320 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_120,local_228,sVar16);
        uVar15 = 0xf;
        if (local_328 != &local_318) {
          uVar15 = local_318;
        }
        if (uVar15 < local_120._M_string_length + local_320) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            uVar18 = local_120.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_120._M_string_length + local_320) goto LAB_00136c5a;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_00136c5a:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_120._M_dataplus._M_p);
        }
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_398 = *puVar9;
          lStack_390 = puVar8[3];
          local_3a8 = &local_398;
        }
        else {
          local_398 = *puVar9;
          local_3a8 = (ulong *)*puVar8;
        }
        local_3a0 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_378 = *plVar7;
          lStack_370 = puVar8[3];
          local_388 = &local_378;
        }
        else {
          local_378 = *plVar7;
          local_388 = (long *)*puVar8;
        }
        local_380 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_388);
        if (local_388 != &local_378) {
          operator_delete(local_388);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
      }
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 100);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_1e0 = &local_1d0;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1d0 = *puVar9;
    lStack_1c8 = plVar7[3];
  }
  else {
    local_1d0 = *puVar9;
    local_1e0 = (ulong *)*plVar7;
  }
  local_1d8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_120,'\x06');
  uVar15 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar15 = local_1d0;
  }
  if (uVar15 < local_120._M_string_length + local_1d8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar18 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_120._M_string_length + local_1d8) goto LAB_00136fee;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_00136fee:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_120._M_dataplus._M_p);
  }
  local_220 = &local_210;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_210 = *puVar9;
    uStack_208 = puVar8[3];
  }
  else {
    local_210 = *puVar9;
    local_220 = (ulong *)*puVar8;
  }
  local_218 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_200 = &local_1f0;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1f0 = *puVar9;
    lStack_1e8 = plVar7[3];
  }
  else {
    local_1f0 = *puVar9;
    local_200 = (ulong *)*plVar7;
  }
  local_1f8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\t');
  uVar15 = 0xf;
  if (local_200 != &local_1f0) {
    uVar15 = local_1f0;
  }
  if (uVar15 < (ulong)(local_48 + local_1f8)) {
    uVar15 = 0xf;
    if (local_50 != local_40) {
      uVar15 = local_40[0];
    }
    if (uVar15 < (ulong)(local_48 + local_1f8)) goto LAB_0013714c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_200);
  }
  else {
LAB_0013714c:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_50);
  }
  local_1c0 = &local_1b0;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_1b0 = *puVar9;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *puVar9;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_238 = *puVar9;
    lStack_230 = plVar7[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *puVar9;
    local_248 = (ulong *)*plVar7;
  }
  local_240 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\t');
  uVar15 = 0xf;
  if (local_248 != &local_238) {
    uVar15 = local_238;
  }
  if (uVar15 < (ulong)(local_68 + local_240)) {
    uVar15 = 0xf;
    if (local_70 != local_60) {
      uVar15 = local_60[0];
    }
    if (uVar15 < (ulong)(local_68 + local_240)) goto LAB_00137299;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_248);
  }
  else {
LAB_00137299:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_70);
  }
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_258 = *puVar9;
    uStack_250 = puVar8[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *puVar9;
    local_268 = (ulong *)*puVar8;
  }
  local_260 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_298 = *puVar9;
    lStack_290 = plVar7[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *puVar9;
    local_2a8 = (ulong *)*plVar7;
  }
  local_2a0 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar15 = 0xf;
  if (local_2a8 != &local_298) {
    uVar15 = local_298;
  }
  if (uVar15 < (ulong)(local_88 + local_2a0)) {
    uVar15 = 0xf;
    if (local_90 != local_80) {
      uVar15 = local_80[0];
    }
    if (uVar15 < (ulong)(local_88 + local_2a0)) goto LAB_001373f0;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_001373f0:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_90);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2c8.field_2._M_allocated_capacity = *psVar10;
    local_2c8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *psVar10;
    local_2c8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2c8._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308.field_2._8_8_ = plVar7[3];
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_308._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x06');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    uVar18 = local_308.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_a8 + local_308._M_string_length) {
    uVar15 = 0xf;
    if (local_b0 != local_a0) {
      uVar15 = local_a0[0];
    }
    if (uVar15 < local_a8 + local_308._M_string_length) goto LAB_0013753d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_308._M_dataplus._M_p);
  }
  else {
LAB_0013753d:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_b0);
  }
  local_2e8 = &local_2d8;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2d8 = *puVar9;
    uStack_2d0 = puVar8[3];
  }
  else {
    local_2d8 = *puVar9;
    local_2e8 = (ulong *)*puVar8;
  }
  local_2e0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368.field_2._8_8_ = plVar7[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_368._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar15 = (local_228->_parameterIndex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[local_228->labelID];
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar13 = uVar15;
    cVar5 = '\x04';
    do {
      cVar17 = cVar5;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_00137682;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_00137682;
      }
      if (uVar13 < 10000) goto LAB_00137682;
      bVar6 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar17 + '\x04';
    } while (bVar6);
    cVar17 = cVar17 + '\x01';
  }
LAB_00137682:
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f8,local_f0,uVar15);
  uVar15 = CONCAT44(uStack_ec,local_f0) + local_368._M_string_length;
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    uVar18 = local_368.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < uVar15) {
    uVar13 = 0xf;
    if (local_f8 != local_e8) {
      uVar13 = local_e8[0];
    }
    if (uVar13 < uVar15) goto LAB_00137704;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_f8,0,(char *)0x0,(ulong)local_368._M_dataplus._M_p);
  }
  else {
LAB_00137704:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_f8);
  }
  local_348 = &local_338;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_338 = *puVar9;
    uStack_330 = puVar8[3];
  }
  else {
    local_338 = *puVar9;
    local_348 = (ulong *)*puVar8;
  }
  local_340 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
  local_328 = &local_318;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_318 = *puVar9;
    lStack_310 = plVar7[3];
  }
  else {
    local_318 = *puVar9;
    local_328 = (ulong *)*plVar7;
  }
  local_320 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x06');
  uVar15 = 0xf;
  if (local_328 != &local_318) {
    uVar15 = local_318;
  }
  if (uVar15 < (ulong)(local_c8 + local_320)) {
    uVar15 = 0xf;
    if (local_d0 != local_c0) {
      uVar15 = local_c0[0];
    }
    if (uVar15 < (ulong)(local_c8 + local_320)) goto LAB_00137852;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_328);
  }
  else {
LAB_00137852:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_d0);
  }
  local_3a8 = &local_398;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_398 = *puVar9;
    lStack_390 = puVar8[3];
  }
  else {
    local_398 = *puVar9;
    local_3a8 = (ulong *)*puVar8;
  }
  local_3a0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_388 = &local_378;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_378 = *plVar11;
    lStack_370 = plVar7[3];
  }
  else {
    local_378 = *plVar11;
    local_388 = (long *)*plVar7;
  }
  local_380 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_388);
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  psVar4 = local_d8;
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  std::operator+(&local_2c8,&local_140,&local_160);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308.field_2._8_8_ = plVar7[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *puVar9;
    local_308._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_308._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_2a8 = &local_298;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x03');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    uVar18 = local_308.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_2a0 + local_308._M_string_length) {
    uVar15 = 0xf;
    if (local_2a8 != &local_298) {
      uVar15 = local_298;
    }
    if (uVar15 < local_2a0 + local_308._M_string_length) goto LAB_00137c55;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2a8,0,(char *)0x0,(ulong)local_308._M_dataplus._M_p);
  }
  else {
LAB_00137c55:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2a8);
  }
  local_2e8 = &local_2d8;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2d8 = *puVar9;
    uStack_2d0 = puVar8[3];
  }
  else {
    local_2d8 = *puVar9;
    local_2e8 = (ulong *)*puVar8;
  }
  local_2e0 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368.field_2._8_8_ = plVar7[3];
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  }
  else {
    local_368.field_2._M_allocated_capacity = *puVar9;
    local_368._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_368._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_268 = &local_258;
  std::__cxx11::string::_M_construct((ulong)&local_268,'\x03');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    uVar18 = local_368.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_260 + local_368._M_string_length) {
    uVar15 = 0xf;
    if (local_268 != &local_258) {
      uVar15 = local_258;
    }
    if (uVar15 < local_260 + local_368._M_string_length) goto LAB_00137d8d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_268,0,(char *)0x0,(ulong)local_368._M_dataplus._M_p);
  }
  else {
LAB_00137d8d:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_268);
  }
  local_348 = &local_338;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_338 = *puVar9;
    uStack_330 = puVar8[3];
  }
  else {
    local_338 = *puVar9;
    local_348 = (ulong *)*puVar8;
  }
  local_340 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_318 = *puVar9;
    lStack_310 = plVar7[3];
    local_328 = &local_318;
  }
  else {
    local_318 = *puVar9;
    local_328 = (ulong *)*plVar7;
  }
  local_320 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_288);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_398 = *puVar9;
    lStack_390 = plVar7[3];
    local_3a8 = &local_398;
  }
  else {
    local_398 = *puVar9;
    local_3a8 = (ulong *)*plVar7;
  }
  local_3a0 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct((ulong)&local_248,'\x03');
  uVar15 = 0xf;
  if (local_3a8 != &local_398) {
    uVar15 = local_398;
  }
  if (uVar15 < (ulong)(local_240 + local_3a0)) {
    uVar15 = 0xf;
    if (local_248 != &local_238) {
      uVar15 = local_238;
    }
    if ((ulong)(local_240 + local_3a0) <= uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_3a8);
      goto LAB_00137f31;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_248);
LAB_00137f31:
  local_388 = &local_378;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_378 = *plVar7;
    lStack_370 = puVar8[3];
  }
  else {
    local_378 = *plVar7;
    local_388 = (long *)*puVar8;
  }
  local_380 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    lVar3 = plVar7[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&psVar4->field_2 + 8) = lVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*plVar7;
    (psVar4->field_2)._M_allocated_capacity = *psVar10;
  }
  psVar4->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  return psVar4;
}

Assistant:

std::string LinearRegression::generateParameters()
{
    _parameterIndex.resize(NUM_OF_VARIABLES+1);
    
    std::string constructParam = offset(1)+"size_t numberOfParameters;\n"+
        offset(1)+"double stepSize, error, *params = nullptr, *grad = nullptr, "+
        "*lambda = nullptr, *prevParams = nullptr, *prevGrad = nullptr;\n";
    
    std::string constructGrad = "";

    std::string numOfParameters = "numberOfParameters = ";
    size_t numOfContParameters = 1;
    
    // Computing the number of parameters we have
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        if (!_categoricalFeatures.test(var))
        {
            _parameterIndex[var] = numOfContParameters;
            ++numOfContParameters;
        }
        else
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            numOfParameters += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    _parameterIndex[NUM_OF_VARIABLES] = 0;
    numOfParameters += std::to_string(numOfContParameters+1)+";\n";
    
    std::string initParam = offset(2)+numOfParameters+
        offset(2)+"params = new double[numberOfParameters];\n"+
        offset(2)+"grad = new double[numberOfParameters]();\n"+
        offset(2)+"prevParams = new double[numberOfParameters];\n"+
        offset(2)+"prevGrad = new double[numberOfParameters];\n"+
        offset(2)+"lambda = new double[numberOfParameters];\n";

    // TODO: make sure you initialize the params and grad arrays
    if (_categoricalFeatures.any()) 
        initParam += offset(2)+"size_t categIndex = "+
            std::to_string(numOfContParameters+1)+";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (_categoricalFeatures.test(var))
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            
            constructGrad += offset(1)+"std::unordered_map<int,size_t> index_"+
                getAttributeName(var)+";\n";

            initParam += offset(2)+"index_"+getAttributeName(var)+".reserve(V"+
                std::to_string(viewID)+".size());\n";
            // offset(2)+"firstindex_"+getAttributeName(var)+" = categIndex;\n";

            initParam += offset(2)+"for (V"+std::to_string(viewID)+
                "_tuple& tuple : V"+
                std::to_string(viewID)+")\n"+
                offset(3)+"index_"+getAttributeName(var)+
                "[tuple."+getAttributeName(var)+"] = categIndex++;\n";
        }
    }

    initParam += offset(2)+"for(size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(2)+"{\n"+
        offset(3)+"params[j] = ((double) (rand() % 800 + 1) - 400) / 100;\n"+
        offset(3)+"lambda[j] = 0.1;\n"+
        offset(2)+"}\n"+
        offset(2)+"params["+std::to_string(_parameterIndex[labelID])+"] = -1;\n"+
        offset(2)+"lambda[0] = 0.0;\n";
    
    std::string outString = constructParam+constructGrad+"\n"+
        offset(1)+"void initParametersGradients()\n"+
        offset(1)+"{\n"+initParam+offset(1)+"}\n";
    
    return outString;
}